

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcUif.c
# Opt level: O2

Vec_Int_t * Wlc_NtkFindUifableMultiplierPairs(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Wlc_Obj_t *pObj;
  Wlc_Obj_t *pObj2;
  int i;
  
  p_00 = Wlc_NtkCollectMultipliers(p);
  p_01 = Vec_IntAlloc(2);
  iVar1 = p_00->nSize;
  i = 0;
  do {
    if (iVar1 <= i) {
      Vec_IntFree(p_00);
      if (p_01->nSize < 1) {
        Vec_IntFree(p_01);
        p_01 = (Vec_Int_t *)0x0;
      }
      return p_01;
    }
    iVar2 = Vec_IntEntry(p_00,i);
    pObj = Wlc_NtkObj(p,iVar2);
    for (iVar2 = 0; iVar1 != iVar2; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(p_00,iVar2);
      pObj2 = Wlc_NtkObj(p,iVar3);
      if (i == iVar2) break;
      iVar3 = Wlc_NtkPairIsUifable(p,pObj,pObj2);
      if (iVar3 != 0) {
        Vec_IntPush(p_01,(int)(((long)pObj - (long)p->pObjs) / 0x18));
        Vec_IntPush(p_01,(int)(((long)pObj2 - (long)p->pObjs) / 0x18));
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkFindUifableMultiplierPairs( Wlc_Ntk_t * p )
{
    Vec_Int_t * vMultis = Wlc_NtkCollectMultipliers( p );
    Vec_Int_t * vPairs = Vec_IntAlloc( 2 );
    Wlc_Obj_t * pObj, * pObj2;  int i, k;
    // iterate through unique pairs
    Wlc_NtkForEachObjVec( vMultis, p, pObj, i )
        Wlc_NtkForEachObjVec( vMultis, p, pObj2, k )
        {
            if ( k == i )  
                break;
            if ( Wlc_NtkPairIsUifable( p, pObj, pObj2 ) )
            {
                Vec_IntPush( vPairs, Wlc_ObjId(p, pObj) );
                Vec_IntPush( vPairs, Wlc_ObjId(p, pObj2) );
            }
        }
    Vec_IntFree( vMultis );
    if ( Vec_IntSize( vPairs ) > 0 )
        return vPairs;
    Vec_IntFree( vPairs );
    return NULL;
}